

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
Page::move_once(Page *this,Direction *direction_1,Direction *direction_2,bool *end_game)

{
  Snake *this_00;
  bool bVar1;
  Direction direction;
  ulong uVar2;
  size_type sVar3;
  reference ppSVar4;
  __normal_iterator<Snake_**,_std::vector<Snake_*,_std::allocator<Snake_*>_>_> local_98;
  __normal_iterator<Snake_**,_std::vector<Snake_*,_std::allocator<Snake_*>_>_> local_90;
  const_iterator local_88;
  Snake **local_80;
  __normal_iterator<Snake_**,_std::vector<Snake_*,_std::allocator<Snake_*>_>_> local_78;
  __normal_iterator<Snake_**,_std::vector<Snake_*,_std::allocator<Snake_*>_>_> local_70;
  const_iterator local_68;
  string local_50;
  int local_2c;
  bool *pbStack_28;
  int i;
  bool *end_game_local;
  Direction *direction_2_local;
  Direction *direction_1_local;
  Page *this_local;
  
  pbStack_28 = end_game;
  end_game_local = (bool *)direction_2;
  direction_2_local = direction_1;
  direction_1_local = (Direction *)this;
  for (local_2c = 0; uVar2 = (ulong)local_2c,
      sVar3 = std::vector<Snake_*,_std::allocator<Snake_*>_>::size(&this->snakes), uVar2 < sVar3;
      local_2c = local_2c + 1) {
    ppSVar4 = std::vector<Snake_*,_std::allocator<Snake_*>_>::operator[]
                        (&this->snakes,(long)local_2c);
    bVar1 = Snake::is_bot(*ppSVar4);
    if (bVar1) {
      ppSVar4 = std::vector<Snake_*,_std::allocator<Snake_*>_>::operator[]
                          (&this->snakes,(long)local_2c);
      this_00 = *ppSVar4;
      ppSVar4 = std::vector<Snake_*,_std::allocator<Snake_*>_>::operator[]
                          (&this->snakes,(long)local_2c);
      direction = determine_direction_move_bot(this,*ppSVar4);
      Snake::move(this_00,direction);
    }
    else {
      ppSVar4 = std::vector<Snake_*,_std::allocator<Snake_*>_>::operator[]
                          (&this->snakes,(long)local_2c);
      Snake::get_name_abi_cxx11_(&local_50,*ppSVar4);
      bVar1 = std::operator==(&local_50,"PLAYER 1");
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar1) {
        ppSVar4 = std::vector<Snake_*,_std::allocator<Snake_*>_>::operator[]
                            (&this->snakes,(long)local_2c);
        Snake::move(*ppSVar4,*direction_2_local);
      }
      else {
        ppSVar4 = std::vector<Snake_*,_std::allocator<Snake_*>_>::operator[]
                            (&this->snakes,(long)local_2c);
        Snake::move(*ppSVar4,*(Direction *)end_game_local);
      }
    }
    ppSVar4 = std::vector<Snake_*,_std::allocator<Snake_*>_>::operator[]
                        (&this->snakes,(long)local_2c);
    handle_crash_wall(this,*ppSVar4);
    ppSVar4 = std::vector<Snake_*,_std::allocator<Snake_*>_>::operator[]
                        (&this->snakes,(long)local_2c);
    handle_eat_food(this,*ppSVar4);
    ppSVar4 = std::vector<Snake_*,_std::allocator<Snake_*>_>::operator[]
                        (&this->snakes,(long)local_2c);
    bVar1 = Snake::check_crash_to_self_body(*ppSVar4);
    if (bVar1) {
      local_78._M_current =
           (Snake **)std::vector<Snake_*,_std::allocator<Snake_*>_>::begin(&this->snakes);
      local_70 = __gnu_cxx::
                 __normal_iterator<Snake_**,_std::vector<Snake_*,_std::allocator<Snake_*>_>_>::
                 operator+(&local_78,(long)local_2c);
      __gnu_cxx::__normal_iterator<Snake*const*,std::vector<Snake*,std::allocator<Snake*>>>::
      __normal_iterator<Snake**>
                ((__normal_iterator<Snake*const*,std::vector<Snake*,std::allocator<Snake*>>> *)
                 &local_68,&local_70);
      local_80 = (Snake **)
                 std::vector<Snake_*,_std::allocator<Snake_*>_>::erase(&this->snakes,local_68);
    }
    else {
      ppSVar4 = std::vector<Snake_*,_std::allocator<Snake_*>_>::operator[]
                          (&this->snakes,(long)local_2c);
      bVar1 = check_crash_to_another_snakes_body(this,*ppSVar4);
      if (bVar1) {
        local_98._M_current =
             (Snake **)std::vector<Snake_*,_std::allocator<Snake_*>_>::begin(&this->snakes);
        local_90 = __gnu_cxx::
                   __normal_iterator<Snake_**,_std::vector<Snake_*,_std::allocator<Snake_*>_>_>::
                   operator+(&local_98,(long)local_2c);
        __gnu_cxx::__normal_iterator<Snake*const*,std::vector<Snake*,std::allocator<Snake*>>>::
        __normal_iterator<Snake**>
                  ((__normal_iterator<Snake*const*,std::vector<Snake*,std::allocator<Snake*>>> *)
                   &local_88,&local_90);
        std::vector<Snake_*,_std::allocator<Snake_*>_>::erase(&this->snakes,local_88);
      }
      else {
        ppSVar4 = std::vector<Snake_*,_std::allocator<Snake_*>_>::operator[]
                            (&this->snakes,(long)local_2c);
        check_and_handle_crash_to_another_snakes_head(this,*ppSVar4);
      }
    }
  }
  check_end_game(this,pbStack_28);
  return;
}

Assistant:

void Page::move_once(Direction& direction_1, Direction& direction_2, bool &end_game)
{
	for(int i = 0; i < snakes.size(); i++)
	{
		if(snakes[i]->is_bot())
		{
			snakes[i]->move(determine_direction_move_bot(snakes[i]));
		}
		else
		{
			if(snakes[i]->get_name() == "PLAYER 1")
				snakes[i]->move(direction_1);

			else					
				snakes[i]->move(direction_2);
		}
		
		handle_crash_wall(snakes[i]);
		handle_eat_food(snakes[i]);

		if(snakes[i]->check_crash_to_self_body())
		{
			snakes.erase(snakes.begin() + i);
			continue;
		}
				
		if(check_crash_to_another_snakes_body(snakes[i]))
		{
			snakes.erase(snakes.begin() + i);
			continue;
		}

		check_and_handle_crash_to_another_snakes_head(snakes[i]);
	}

	check_end_game(end_game);
}